

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimedatabase.cpp
# Opt level: O1

bool __thiscall
QMimeDatabasePrivate::mimeInherits(QMimeDatabasePrivate *this,QString *mime,QString *parent)

{
  QMutex *this_00;
  __pointer_type copy;
  bool bVar1;
  
  this_00 = &this->mutex;
  if ((this->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p == (__pointer_type)0x0) {
    LOCK();
    bVar1 = (this_00->super_QBasicMutex).d_ptr._q_value._M_b._M_p == (__pointer_type)0x0;
    if (bVar1) {
      (this_00->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x1;
    }
    UNLOCK();
    if (bVar1) goto LAB_004b15ea;
  }
  QBasicMutex::lockInternal(&this_00->super_QBasicMutex);
LAB_004b15ea:
  bVar1 = inherits(this,mime,parent);
  LOCK();
  copy = (this_00->super_QBasicMutex).d_ptr._q_value._M_b._M_p;
  (this_00->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
  UNLOCK();
  if (copy != (__pointer_type)0x1) {
    QBasicMutex::unlockInternalFutex(&this_00->super_QBasicMutex,copy);
  }
  return bVar1;
}

Assistant:

bool QMimeDatabasePrivate::mimeInherits(const QString &mime, const QString &parent)
{
    QMutexLocker locker(&mutex);
    return inherits(mime, parent);
}